

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bandpre.c
# Opt level: O0

int CVBandPrecGetWorkSpace(void *cvode_mem,long *lenrwBP,long *leniwBP)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  CVodeMem in_RDI;
  int flag;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  CVBandPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  void *local_30;
  long *local_20;
  long *local_18;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0xe1,"CVBandPrecGetWorkSpace",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bandpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0xe9,"CVBandPrecGetWorkSpace",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bandpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else {
    local_30 = in_RDI->cv_lmem;
    if (*(long *)((long)local_30 + 0xf0) == 0) {
      cvProcessError(in_RDI,-5,0xf1,"CVBandPrecGetWorkSpace",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bandpre.c"
                     ,"Band preconditioner memory is NULL. CVBandPrecInit must be called.");
      local_4 = -5;
    }
    else {
      local_38 = *(long *)((long)local_30 + 0xf0);
      *in_RDX = 4;
      *in_RSI = 0;
      local_20 = in_RDX;
      local_18 = in_RSI;
      if (in_RDI->cv_tempv->ops->nvspace !=
          (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        N_VSpace(in_RDI->cv_tempv,&local_40,&local_48);
        *local_20 = local_48 * 2 + *local_20;
        *local_18 = local_40 * 2 + *local_18;
      }
      if (*(long *)(*(long *)(*(long *)(local_38 + 0x18) + 8) + 0x48) != 0) {
        iVar1 = SUNMatSpace(*(undefined8 *)(local_38 + 0x18),&local_50,&local_58);
        if (iVar1 != 0) {
          return -1;
        }
        *local_20 = local_58 + *local_20;
        *local_18 = local_50 + *local_18;
      }
      if (*(long *)(*(long *)(*(long *)(local_38 + 0x20) + 8) + 0x48) != 0) {
        iVar1 = SUNMatSpace(*(undefined8 *)(local_38 + 0x20),&local_50,&local_58);
        if (iVar1 != 0) {
          return -1;
        }
        *local_20 = local_58 + *local_20;
        *local_18 = local_50 + *local_18;
      }
      if (*(long *)(*(long *)(*(long *)(local_38 + 0x28) + 8) + 0x60) != 0) {
        iVar1 = SUNLinSolSpace(*(undefined8 *)(local_38 + 0x28),&local_50,&local_58);
        if (iVar1 != 0) {
          return -1;
        }
        *local_20 = local_58 + *local_20;
        *local_18 = local_50 + *local_18;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVBandPrecGetWorkSpace(void* cvode_mem, long int* lenrwBP, long int* leniwBP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBandPrecData pdata;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBandPrecData)cvls_mem->P_data;

  /* sum space requirements for all objects in pdata */
  *leniwBP = 4;
  *lenrwBP = 0;
  if (cv_mem->cv_tempv->ops->nvspace)
  {
    N_VSpace(cv_mem->cv_tempv, &lrw1, &liw1);
    *leniwBP += 2 * liw1;
    *lenrwBP += 2 * lrw1;
  }
  if (pdata->savedJ->ops->space)
  {
    flag = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }
  if (pdata->savedP->ops->space)
  {
    flag = SUNMatSpace(pdata->savedP, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    if (flag != 0) { return (-1); }
    *leniwBP += liw;
    *lenrwBP += lrw;
  }

  return (CVLS_SUCCESS);
}